

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O3

bool __thiscall QHttpSocketEngine::readHttpHeader(QHttpSocketEngine *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  qint64 qVar4;
  ReplyState RVar5;
  long *plVar6;
  QHttpNetworkReplyPrivate *this_00;
  long in_FS_OFFSET;
  bool contentLengthOk;
  QArrayData *local_40 [3];
  char local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(int *)(lVar1 + 0x108) == 5) {
    plVar6 = *(long **)(lVar1 + 0x100);
    this_00 = (QHttpNetworkReplyPrivate *)plVar6[1];
    RVar5 = this_00->state;
    if (RVar5 == ReadingStatusState) {
LAB_002245a1:
      qVar4 = QHttpNetworkReplyPrivate::readStatus(this_00,*(QIODevice **)(lVar1 + 0xf8));
      if (qVar4 == -1) goto LAB_002246b4;
      plVar6 = *(long **)(lVar1 + 0x100);
      this_00 = (QHttpNetworkReplyPrivate *)plVar6[1];
      RVar5 = this_00->state;
      bVar2 = true;
      if (RVar5 == ReadingStatusState) goto LAB_002246b6;
    }
    else if (RVar5 == NothingDoneState) {
      QHttpNetworkReplyPrivate::clearHttpLayerInformation(this_00);
      this_00 = *(QHttpNetworkReplyPrivate **)(*(long *)(lVar1 + 0x100) + 8);
      this_00->state = ReadingStatusState;
      goto LAB_002245a1;
    }
    if (RVar5 == ReadingHeaderState) {
      qVar4 = QHttpNetworkReplyPrivate::readHeader(this_00,*(QIODevice **)(lVar1 + 0xf8));
      if (qVar4 == -1) goto LAB_002246b4;
      plVar6 = *(long **)(lVar1 + 0x100);
      bVar2 = true;
      if (*(int *)(plVar6[1] + 0xd0) == 2) goto LAB_002246b6;
    }
    local_21 = -0x56;
    (**(code **)(*plVar6 + 0x98))(local_40,plVar6,0xe,"Content-Length");
    iVar3 = QByteArray::toInt((bool *)local_40,(int)&local_21);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],1,0x10);
      }
    }
    if ((0 < iVar3) && (local_21 != '\0')) {
      *(int *)(lVar1 + 0x120) = iVar3;
    }
    *(undefined4 *)(lVar1 + 0x108) = 4;
    bVar2 = true;
  }
  else {
LAB_002246b4:
    bVar2 = false;
  }
LAB_002246b6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QHttpSocketEngine::readHttpHeader()
{
    Q_D(QHttpSocketEngine);

    if (d->state != ReadResponseHeader)
        return false;

    bool ok = true;
    if (d->reply->d_func()->state == QHttpNetworkReplyPrivate::NothingDoneState) {
        // do not keep old content sizes, status etc. around
        d->reply->d_func()->clearHttpLayerInformation();
        d->reply->d_func()->state = QHttpNetworkReplyPrivate::ReadingStatusState;
    }
    if (d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingStatusState) {
        ok = d->reply->d_func()->readStatus(d->socket) != -1;
        if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingStatusState)
            return true; //Not done parsing headers yet, wait for more data
    }
    if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingHeaderState) {
        ok = d->reply->d_func()->readHeader(d->socket) != -1;
        if (ok && d->reply->d_func()->state == QHttpNetworkReplyPrivate::ReadingHeaderState)
            return true; //Not done parsing headers yet, wait for more data
    }
    if (ok) {
        bool contentLengthOk;
        int contentLength = d->reply->headerField("Content-Length").toInt(&contentLengthOk);
        if (contentLengthOk && contentLength > 0)
            d->pendingResponseData = contentLength;
        d->state = ReadResponseContent; // we are done reading the header
    }
    return ok;
}